

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowSpeedTurn.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_53ac6::LowSpeedTurn::reset(LowSpeedTurn *this)

{
  SimpleVehicle_3 *pSVar1;
  
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1c])((anonymous_namespace)::LowSpeedTurn::startSpeed,this);
  (this->super_SimpleVehicle).super_SimpleVehicle_3.
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._position.x =
       (anonymous_namespace)::LowSpeedTurn::startX;
  pSVar1 = &(this->super_SimpleVehicle).super_SimpleVehicle_3;
  (pSVar1->super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>).
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._position.y = 0.0;
  (pSVar1->super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>).
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._position.z = 0.0;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1f])(0x3e99999a,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x21])(0x3fc00000,this);
  (anonymous_namespace)::LowSpeedTurn::startX = (anonymous_namespace)::LowSpeedTurn::startX + 2.0;
  (anonymous_namespace)::LowSpeedTurn::startSpeed =
       (anonymous_namespace)::LowSpeedTurn::startSpeed + 0.15;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,15.0,0x96);
  return;
}

Assistant:

void reset (void)
        {
            // reset vehicle state
            SimpleVehicle::reset ();

            // speed along Forward direction.
            setSpeed (startSpeed);

            // initial position along X axis
            setPosition (startX, 0, 0);

            // steering force clip magnitude
            setMaxForce (0.3f);

            // velocity  clip magnitude
            setMaxSpeed (1.5f);

            // for next instance: step starting location
            startX += 2;

            // for next instance: step speed
            startSpeed += 0.15f;

            // 15 seconds and 150 points along the trail
            setTrailParameters (15, 150);
        }